

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo::Clear
          (TreeEnsembleParameters_TreeNode_EvaluationInfo *this)

{
  this->evaluationindex_ = 0;
  this->evaluationvalue_ = 0.0;
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void TreeEnsembleParameters_TreeNode_EvaluationInfo::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.TreeEnsembleParameters.TreeNode.EvaluationInfo)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  ::memset(&evaluationindex_, 0, static_cast<size_t>(
      reinterpret_cast<char*>(&evaluationvalue_) -
      reinterpret_cast<char*>(&evaluationindex_)) + sizeof(evaluationvalue_));
  _internal_metadata_.Clear<std::string>();
}